

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

bool __thiscall CLI::App::_parse_single_config(App *this,ConfigItem *item,size_t level)

{
  pointer pbVar1;
  _Alloc_hider _Var2;
  element_type *peVar3;
  bool bVar4;
  ostream *poVar5;
  App *this_00;
  Option *this_01;
  ConfigError *__return_storage_ptr__;
  undefined8 uVar6;
  string local_e0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  pbVar1 = (item->parents).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (level < (ulong)((long)(item->parents).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
    poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&::std::cout,pbVar1[level]._M_dataplus._M_p,
                        pbVar1[level]._M_string_length);
    ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    ::std::ostream::put((char)poVar5);
    ::std::ostream::flush();
    pbVar1 = (item->parents).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(item->parents).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= level) {
      uVar6 = ::std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,level);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      _Unwind_Resume(uVar6);
    }
    _Var2._M_p = pbVar1[level]._M_dataplus._M_p;
    local_e0[0]._M_dataplus._M_p = (pointer)&local_e0[0].field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,_Var2._M_p,_Var2._M_p + pbVar1[level]._M_string_length);
    this_00 = get_subcommand(this,local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0[0]._M_dataplus._M_p != &local_e0[0].field_2) {
      operator_delete(local_e0[0]._M_dataplus._M_p,local_e0[0].field_2._M_allocated_capacity + 1);
    }
    bVar4 = _parse_single_config(this_00,item,level + 1);
  }
  else {
    ::std::operator+(&local_a0,"--",&item->name);
    this_01 = get_option(this,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((this_01->super_OptionBase<CLI::Option>).configurable_ == false) {
      __return_storage_ptr__ = (ConfigError *)__cxa_allocate_exception(0x38);
      ConfigItem::fullname_abi_cxx11_(&local_50,item);
      ConfigError::NotConfigurable(__return_storage_ptr__,&local_50);
      __cxa_throw(__return_storage_ptr__,&ConfigError::typeinfo,Error::~Error);
    }
    bVar4 = true;
    if ((this_01->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_01->results_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (this_01->type_size_ == 0) {
        peVar3 = (this->config_formatter_).
                 super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar3->_vptr_Config[2])(&local_68,peVar3,item);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this_01->results_,&local_68);
        this_01->callback_run_ = false;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_80,&item->inputs);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this_01->results_,&local_80);
        this_01->callback_run_ = false;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_80);
        Option::run_callback(this_01);
      }
    }
  }
  return bVar4;
}

Assistant:

bool _parse_single_config(const ConfigItem &item, size_t level = 0) {
        if(level < item.parents.size()) {
            App *subcom;
            try {
                std::cout << item.parents.at(level) << std::endl;
                subcom = get_subcommand(item.parents.at(level));
            } catch(const OptionNotFound &) {
                return false;
            }
            return subcom->_parse_single_config(item, level + 1);
        }

        Option *op;
        try {
            op = get_option("--" + item.name);
        } catch(const OptionNotFound &) {
            // If the option was not present
            if(get_allow_config_extras())
                // Should we worry about classifying the extras properly?
                missing_.emplace_back(detail::Classifer::NONE, item.fullname());
            return false;
        }

        if(!op->get_configurable())
            throw ConfigError::NotConfigurable(item.fullname());

        if(op->empty()) {
            // Flag parsing
            if(op->get_type_size() == 0) {
                op->set_results(config_formatter_->to_flag(item));
            } else {
                op->set_results(item.inputs);
                op->run_callback();
            }
        }

        return true;
    }